

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O0

void __thiscall CS248::StaticScene::Triangle::draw(Triangle *this,Color *c)

{
  undefined4 *in_RSI;
  long in_RDI;
  
  glColor4f(*in_RSI,in_RSI[1],in_RSI[2],in_RSI[3]);
  glBegin(4);
  glVertex3d(*(undefined8 *)(*(long *)(*(long *)(in_RDI + 8) + 8) + *(long *)(in_RDI + 0x10) * 0x18)
             ,*(undefined8 *)
               (*(long *)(*(long *)(in_RDI + 8) + 8) + *(long *)(in_RDI + 0x10) * 0x18 + 8),
             *(undefined8 *)
              (*(long *)(*(long *)(in_RDI + 8) + 8) + *(long *)(in_RDI + 0x10) * 0x18 + 0x10));
  glVertex3d(*(undefined8 *)(*(long *)(*(long *)(in_RDI + 8) + 8) + *(long *)(in_RDI + 0x18) * 0x18)
             ,*(undefined8 *)
               (*(long *)(*(long *)(in_RDI + 8) + 8) + *(long *)(in_RDI + 0x18) * 0x18 + 8),
             *(undefined8 *)
              (*(long *)(*(long *)(in_RDI + 8) + 8) + *(long *)(in_RDI + 0x18) * 0x18 + 0x10));
  glVertex3d(*(undefined8 *)(*(long *)(*(long *)(in_RDI + 8) + 8) + *(long *)(in_RDI + 0x20) * 0x18)
             ,*(undefined8 *)
               (*(long *)(*(long *)(in_RDI + 8) + 8) + *(long *)(in_RDI + 0x20) * 0x18 + 8),
             *(undefined8 *)
              (*(long *)(*(long *)(in_RDI + 8) + 8) + *(long *)(in_RDI + 0x20) * 0x18 + 0x10));
  glEnd();
  return;
}

Assistant:

void Triangle::draw(const Color& c) const {
  glColor4f(c.r, c.g, c.b, c.a);
  glBegin(GL_TRIANGLES);
  glVertex3d(mesh->positions[v1].x, mesh->positions[v1].y,
             mesh->positions[v1].z);
  glVertex3d(mesh->positions[v2].x, mesh->positions[v2].y,
             mesh->positions[v2].z);
  glVertex3d(mesh->positions[v3].x, mesh->positions[v3].y,
             mesh->positions[v3].z);
  glEnd();
}